

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_processing_impl.cc
# Opt level: O2

bool __thiscall webrtc::AudioProcessingImpl::is_fwd_processed(AudioProcessingImpl *this)

{
  char cVar1;
  undefined1 uVar2;
  
  if ((this->capture_nonlocked_).beamformer_enabled == false) {
    cVar1 = (**(code **)(*(long *)(((this->public_submodules_)._M_t.
                                    super___uniq_ptr_impl<webrtc::AudioProcessingImpl::ApmPublicSubmodules,_std::default_delete<webrtc::AudioProcessingImpl::ApmPublicSubmodules>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_webrtc::AudioProcessingImpl::ApmPublicSubmodules_*,_std::default_delete<webrtc::AudioProcessingImpl::ApmPublicSubmodules>_>
                                    .
                                    super__Head_base<0UL,_webrtc::AudioProcessingImpl::ApmPublicSubmodules_*,_false>
                                   ._M_head_impl)->high_pass_filter)._M_t.
                                  super___uniq_ptr_impl<webrtc::HighPassFilterImpl,_std::default_delete<webrtc::HighPassFilterImpl>_>
                        + 8))();
    if (cVar1 == '\0') {
      cVar1 = (**(code **)(*(long *)(((this->public_submodules_)._M_t.
                                      super___uniq_ptr_impl<webrtc::AudioProcessingImpl::ApmPublicSubmodules,_std::default_delete<webrtc::AudioProcessingImpl::ApmPublicSubmodules>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_webrtc::AudioProcessingImpl::ApmPublicSubmodules_*,_std::default_delete<webrtc::AudioProcessingImpl::ApmPublicSubmodules>_>
                                      .
                                      super__Head_base<0UL,_webrtc::AudioProcessingImpl::ApmPublicSubmodules_*,_false>
                                     ._M_head_impl)->noise_suppression)._M_t.
                                    super___uniq_ptr_impl<webrtc::NoiseSuppressionImpl,_std::default_delete<webrtc::NoiseSuppressionImpl>_>
                          + 8))();
      if (cVar1 == '\0') {
        cVar1 = (**(code **)(*(long *)(((this->public_submodules_)._M_t.
                                        super___uniq_ptr_impl<webrtc::AudioProcessingImpl::ApmPublicSubmodules,_std::default_delete<webrtc::AudioProcessingImpl::ApmPublicSubmodules>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_webrtc::AudioProcessingImpl::ApmPublicSubmodules_*,_std::default_delete<webrtc::AudioProcessingImpl::ApmPublicSubmodules>_>
                                        .
                                        super__Head_base<0UL,_webrtc::AudioProcessingImpl::ApmPublicSubmodules_*,_false>
                                       ._M_head_impl)->echo_cancellation)._M_t + 8))();
        if (cVar1 == '\0') {
          cVar1 = (**(code **)(*(long *)(((this->public_submodules_)._M_t.
                                          super___uniq_ptr_impl<webrtc::AudioProcessingImpl::ApmPublicSubmodules,_std::default_delete<webrtc::AudioProcessingImpl::ApmPublicSubmodules>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_webrtc::AudioProcessingImpl::ApmPublicSubmodules_*,_std::default_delete<webrtc::AudioProcessingImpl::ApmPublicSubmodules>_>
                                          .
                                          super__Head_base<0UL,_webrtc::AudioProcessingImpl::ApmPublicSubmodules_*,_false>
                                         ._M_head_impl)->echo_control_mobile)._M_t.
                                        super___uniq_ptr_impl<webrtc::EchoControlMobileImpl,_std::default_delete<webrtc::EchoControlMobileImpl>_>
                              + 8))();
          if (cVar1 == '\0') {
            uVar2 = (**(code **)(*(long *)(((this->public_submodules_)._M_t.
                                            super___uniq_ptr_impl<webrtc::AudioProcessingImpl::ApmPublicSubmodules,_std::default_delete<webrtc::AudioProcessingImpl::ApmPublicSubmodules>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_webrtc::AudioProcessingImpl::ApmPublicSubmodules_*,_std::default_delete<webrtc::AudioProcessingImpl::ApmPublicSubmodules>_>
                                            .
                                            super__Head_base<0UL,_webrtc::AudioProcessingImpl::ApmPublicSubmodules_*,_false>
                                           ._M_head_impl)->gain_control)._M_t.
                                          super___uniq_ptr_impl<webrtc::GainControlImpl,_std::default_delete<webrtc::GainControlImpl>_>
                                + 8))();
            return (bool)uVar2;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool AudioProcessingImpl::is_fwd_processed() const {
  // The beamformer, noise suppressor and highpass filter
  // modify the data.
  if (capture_nonlocked_.beamformer_enabled ||
      public_submodules_->high_pass_filter->is_enabled() ||
      public_submodules_->noise_suppression->is_enabled() ||
      public_submodules_->echo_cancellation->is_enabled() ||
      public_submodules_->echo_control_mobile->is_enabled() ||
      public_submodules_->gain_control->is_enabled()) {
    return true;
  }

  // The capture data is otherwise unchanged.
  return false;
}